

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeIncrPopulate(IncrMerger *pIncr)

{
  uint nData;
  i64 iStart;
  MergeEngine *pMVar1;
  PmaReader *pPVar2;
  bool bVar3;
  int nData_00;
  int iVar4;
  long lVar5;
  ulong uVar6;
  u64 v;
  long in_FS_OFFSET;
  PmaWriter writer;
  int local_7c;
  undefined1 *local_78;
  u8 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  sqlite3_file *psStack_50;
  undefined1 *local_48;
  undefined2 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iStart = pIncr->iStartOff;
  pMVar1 = pIncr->pMerger;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  psStack_50 = (sqlite3_file *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  vdbePmaWriterInit(pIncr->aFile[1].pFd,(PmaWriter *)&local_78,pIncr->pTask->pSorter->pgsz,iStart);
  do {
    pPVar2 = pMVar1->aReadr;
    iVar4 = pMVar1->aTree[1];
    if (pPVar2[iVar4].pFd == (sqlite3_file *)0x0) {
LAB_0015a996:
      iVar4 = vdbePmaWriterFinish((PmaWriter *)&local_78,&pIncr->aFile[1].iEof);
      goto LAB_0015a9a9;
    }
    nData = pPVar2[iVar4].nKey;
    v = (u64)(int)nData;
    lVar5 = 1;
    uVar6 = v;
    if (0x7f < nData) {
      do {
        lVar5 = lVar5 + 1;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar6 >> 7;
      } while (bVar3);
    }
    if (pIncr->mxSz + iStart < (long)(local_58 + lVar5 + (long)(int)puStack_60 + v))
    goto LAB_0015a996;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = 0xaaaa;
    nData_00 = sqlite3PutVarint((uchar *)&local_48,v);
    vdbePmaWriteBlob((PmaWriter *)&local_78,(u8 *)&local_48,nData_00);
    vdbePmaWriteBlob((PmaWriter *)&local_78,pPVar2[iVar4].aKey,nData);
    iVar4 = vdbeMergeEngineStep(pIncr->pMerger,&local_7c);
  } while (iVar4 == 0);
  vdbePmaWriterFinish((PmaWriter *)&local_78,&pIncr->aFile[1].iEof);
LAB_0015a9a9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int vdbeIncrPopulate(IncrMerger *pIncr){
  int rc = SQLITE_OK;
  int rc2;
  i64 iStart = pIncr->iStartOff;
  SorterFile *pOut = &pIncr->aFile[1];
  SortSubtask *pTask = pIncr->pTask;
  MergeEngine *pMerger = pIncr->pMerger;
  PmaWriter writer;
  assert( pIncr->bEof==0 );

  vdbeSorterPopulateDebug(pTask, "enter");

  vdbePmaWriterInit(pOut->pFd, &writer, pTask->pSorter->pgsz, iStart);
  while( rc==SQLITE_OK ){
    int dummy;
    PmaReader *pReader = &pMerger->aReadr[ pMerger->aTree[1] ];
    int nKey = pReader->nKey;
    i64 iEof = writer.iWriteOff + writer.iBufEnd;

    /* Check if the output file is full or if the input has been exhausted.
    ** In either case exit the loop. */
    if( pReader->pFd==0 ) break;
    if( (iEof + nKey + sqlite3VarintLen(nKey))>(iStart + pIncr->mxSz) ) break;

    /* Write the next key to the output. */
    vdbePmaWriteVarint(&writer, nKey);
    vdbePmaWriteBlob(&writer, pReader->aKey, nKey);
    assert( pIncr->pMerger->pTask==pTask );
    rc = vdbeMergeEngineStep(pIncr->pMerger, &dummy);
  }

  rc2 = vdbePmaWriterFinish(&writer, &pOut->iEof);
  if( rc==SQLITE_OK ) rc = rc2;
  vdbeSorterPopulateDebug(pTask, "exit");
  return rc;
}